

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmTruth.c
# Opt level: O0

int Mpm_CutTruthMinimize6(Mpm_Man_t *p,Mpm_Cut_t *pCut)

{
  word t_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word local_38;
  word t;
  int nSuppSize;
  int k;
  int i;
  uint uSupport;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *p_local;
  
  _i = pCut;
  pCut_local = (Mpm_Cut_t *)p;
  iVar1 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
  pwVar4 = Mpm_CutTruth(p,iVar1);
  t_00 = *pwVar4;
  local_38 = t_00;
  iVar1 = Mpm_CutLeafNum(_i);
  k = Abc_Tt6SupportAndSize(t_00,iVar1,(int *)&t);
  iVar1 = (int)t;
  iVar2 = Mpm_CutLeafNum(_i);
  if (iVar1 == iVar2) {
    p_local._4_4_ = 0;
  }
  else {
    pCut_local[0x486].hNext = (uint)((int)t < 2) + pCut_local[0x486].hNext;
    t._4_4_ = 0;
    nSuppSize = 0;
    while( true ) {
      iVar1 = nSuppSize;
      iVar2 = Mpm_CutLeafNum(_i);
      if (iVar2 <= iVar1) break;
      if (((uint)k >> ((byte)nSuppSize & 0x1f) & 1) != 0) {
        if (t._4_4_ < nSuppSize) {
          _i->pLeaves[t._4_4_] = _i->pLeaves[nSuppSize];
          Abc_TtSwapVars(&local_38,*(int *)&pCut_local[1].field_0x4,t._4_4_,nSuppSize);
        }
        t._4_4_ = t._4_4_ + 1;
      }
      nSuppSize = nSuppSize + 1;
    }
    if (t._4_4_ != (int)t) {
      __assert_fail("k == nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x5f,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    *(uint *)&_i->field_0x4 = *(uint *)&_i->field_0x4 & 0x7ffffff | (int)t << 0x1b;
    iVar1 = Abc_TtSupportSize(&local_38,6);
    if ((int)t != iVar1) {
      __assert_fail("nSuppSize == Abc_TtSupportSize(&t, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x61,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    iVar1 = Vec_MemHashInsert(*(Vec_Mem_t **)pCut_local[0x196].pLeaves,&local_38);
    iVar2 = Abc_LitIsCompl(*(uint *)&_i->field_0x4 & 0x1ffffff);
    uVar3 = Abc_Var2Lit(iVar1,iVar2);
    *(uint *)&_i->field_0x4 = *(uint *)&_i->field_0x4 & 0xfe000000 | uVar3 & 0x1ffffff;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Mpm_CutTruthMinimize6( Mpm_Man_t * p, Mpm_Cut_t * pCut )
{
    unsigned uSupport;
    int i, k, nSuppSize;
    // compute the support of the cut's function
    word t = *Mpm_CutTruth( p, Abc_Lit2Var(pCut->iFunc) );
    uSupport = Abc_Tt6SupportAndSize( t, Mpm_CutLeafNum(pCut), &nSuppSize );
    if ( nSuppSize == Mpm_CutLeafNum(pCut) )
        return 0;
    p->nSmallSupp += (int)(nSuppSize < 2);
    // update leaves and signature
    for ( i = k = 0; i < Mpm_CutLeafNum(pCut); i++ )
    {
        if ( ((uSupport >> i) & 1) )
        {
            if ( k < i )
            {
                pCut->pLeaves[k] = pCut->pLeaves[i];
                Abc_TtSwapVars( &t, p->nLutSize, k, i );
            }
            k++;
        }
    }
    assert( k == nSuppSize );
    pCut->nLeaves = nSuppSize;
    assert( nSuppSize == Abc_TtSupportSize(&t, 6) );
    // save the result
    pCut->iFunc = Abc_Var2Lit( Vec_MemHashInsert(p->vTtMem, &t), Abc_LitIsCompl(pCut->iFunc) );
    return 1;
}